

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Neuron.cpp
# Opt level: O0

void __thiscall Neuron::connectTo(Neuron *this,Neuron *target,float weight)

{
  Connection local_38;
  float local_1c;
  Neuron *pNStack_18;
  float weight_local;
  Neuron *target_local;
  Neuron *this_local;
  
  local_1c = weight;
  pNStack_18 = target;
  target_local = this;
  Connection::Connection(&local_38,target,weight,100.0,100.0);
  std::vector<Connection,_std::allocator<Connection>_>::push_back(&this->m_connections,&local_38);
  return;
}

Assistant:

void Neuron::connectTo(Neuron* target, float weight)
{
    m_connections.push_back({target, weight});
}